

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string __thiscall
cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>::to_string_abi_cxx11_
          (holder<std::pair<cs_impl::any,_cs_impl::any>_> *this)

{
  proxy *in_RDI;
  pair *in_stack_00000068;
  
  to_string<std::pair<cs_impl::any,cs_impl::any>>(in_stack_00000068);
  return (string)in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}